

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.hpp
# Opt level: O1

void __thiscall rek::sample::AliasSampler::initSampler(AliasSampler *this)

{
  double dVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pdVar4;
  uint uVar5;
  uint uVar6;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar7;
  
  if (this->N == 0) {
    __assert_fail("1 <= N",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zouzias[P]REK-CPP/src/sampler.hpp"
                  ,0x46,"void rek::sample::AliasSampler::initSampler()");
  }
  if (this->N != 0) {
    puVar2 = (this->A).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->Y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = 1;
    do {
      uVar5 = (uint)uVar10;
      puVar2[uVar10] = uVar5;
      puVar3[uVar10] = uVar5;
      dVar1 = pdVar4[uVar10];
      if (dVar1 < 0.0) {
        __assert_fail("Y[i] >= 0.0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/zouzias[P]REK-CPP/src/sampler.hpp"
                      ,0x4a,"void rek::sample::AliasSampler::initSampler()");
      }
      uVar8 = this->N;
      pdVar4[uVar10] = dVar1 * (double)uVar8;
      uVar10 = (ulong)(uVar5 + 1);
    } while (uVar5 + 1 <= uVar8);
  }
  puVar2 = (this->B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *puVar2 = 0;
  pdVar4 = (this->Y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar4 = 0.0;
  uVar5 = this->N + 1;
  puVar2[uVar5] = uVar5;
  uVar10 = (ulong)(this->N + 1);
  pdVar4[uVar10] = 2.0;
  uVar9 = 0;
  while( true ) {
    do {
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
      uVar5 = puVar2[uVar9];
    } while (pdVar4[uVar5] <= 1.0 && pdVar4[uVar5] != 1.0);
    do {
      uVar7 = (uint)uVar10;
      uVar6 = uVar7 - 1;
      uVar10 = (ulong)uVar6;
    } while (1.0 <= pdVar4[puVar2[uVar10]]);
    if (uVar6 <= uVar8) break;
    puVar2[uVar9] = puVar2[uVar10];
    puVar2[uVar10] = uVar5;
  }
  if (uVar6 != 0) {
    puVar3 = (this->A).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      do {
        uVar8 = uVar7;
        uVar5 = puVar2[uVar8];
        dVar1 = pdVar4[uVar5];
        uVar7 = uVar8 + 1;
      } while (dVar1 <= 1.0);
      uVar7 = puVar2[uVar10];
      if (1.0 <= pdVar4[uVar7]) {
        __assert_fail("Y[B[i]] < 1.0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/zouzias[P]REK-CPP/src/sampler.hpp"
                      ,0x65,"void rek::sample::AliasSampler::initSampler()");
      }
      if (this->N < uVar8) {
        return;
      }
      if (dVar1 <= 1.0) {
        __assert_fail("Y[B[j]] > 1.0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/zouzias[P]REK-CPP/src/sampler.hpp"
                      ,0x68,"void rek::sample::AliasSampler::initSampler()");
      }
      pdVar4[uVar5] = dVar1 + pdVar4[uVar7] + -1.0;
      puVar3[uVar7] = uVar5;
      if (1.0 < pdVar4[puVar2[uVar8]] || pdVar4[puVar2[uVar8]] == 1.0) {
        uVar10 = (ulong)((uint)uVar10 - 1);
      }
      else {
        if (uVar8 <= (uint)uVar10) {
          __assert_fail("i < j",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/zouzias[P]REK-CPP/src/sampler.hpp"
                        ,0x6c,"void rek::sample::AliasSampler::initSampler()");
        }
        uVar5 = puVar2[uVar10];
        puVar2[uVar10] = puVar2[uVar8];
        puVar2[uVar8] = uVar5;
        uVar8 = uVar8 + 1;
      }
      uVar7 = uVar8;
    } while ((int)uVar10 != 0);
  }
  return;
}

Assistant:

void initSampler() {
    unsigned int i, j, k;
    assert(1 <= N);
    for (i = 1; i <= N; i++) {
      A[i] = i;
      B[i] = i; /* initial destins=stay there */
      assert(Y[i] >= 0.0);
      Y[i] = Y[i] * N; /* scale probvec */
    }
    B[0] = 0;
    Y[0] = 0.0;
    B[N + 1] = N + 1;
    Y[N + 1] = 2.0; /* sentinels */
    i = 0;
    j = N + 1;
    for (;;) {
      do {
        i++;
      } while (Y[B[i]] < 1.0); /* find i so X[B[i]] needs more */
      do {
        j--;
      } while (Y[B[j]] >= 1.0); /* find j so X[B[j]] wants less */
      if (i >= j) break;
      k = B[i];
      B[i] = B[j];
      B[j] = k; /* swap B[i], B[j] */
    }

    i = j;
    j++;
    while (i > 0) {
      while (Y[B[j]] <= 1.0) j++;
      /* find j so X[B[j]] needs more */
      assert(Y[B[i]] < 1.0); /* meanwhile X[B[i]] wants less */
      if (j > N) break;
      assert(j <= N);
      assert(Y[B[j]] > 1.0);
      Y[B[j]] -= 1.0 - Y[B[i]]; /* B[i] will donate to B[j] to fix up */
      A[B[i]] = B[j];
      if (Y[B[j]] < 1.0) { /* X[B[j]] now wants less so readjust ordering */
        assert(i < j);
        k = B[i];
        B[i] = B[j];
        B[j] = k; /* swap B[j], B[i] */
        j++;
      } else
        i--;
    }
  }